

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::PythonGenerator::GenFieldTy_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  bool bVar2;
  long lVar3;
  char *__s;
  string ty;
  allocator<char> local_31;
  string local_30;
  
  BVar1 = (field->value).type.base_type;
  if (BVar1 == BASE_TYPE_ARRAY || BVar1 - BASE_TYPE_UTYPE < 0xc) {
    GenTypeBasic_abi_cxx11_(&local_30,this,&(field->value).type);
    lVar3 = std::__cxx11::string::find((char *)&local_30,0x2640ab);
    if (lVar3 == -1) {
      lVar3 = std::__cxx11::string::find((char *)&local_30,0x25b700);
      if (lVar3 == -1) {
        bVar2 = std::operator==(&local_30,"bool");
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"bool",&local_31);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"Any",&local_31);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"float",&local_31);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"int",&local_31);
    }
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    if ((BVar1 == BASE_TYPE_STRUCT) && (((field->value).type.struct_def)->fixed == true)) {
      __s = "Any";
    }
    else {
      __s = "int";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFieldTy(const FieldDef &field) const {
    if (IsScalar(field.value.type.base_type) || IsArray(field.value.type)) {
      const std::string ty = GenTypeBasic(field.value.type);
      if (ty.find("int") != std::string::npos) { return "int"; }

      if (ty.find("float") != std::string::npos) { return "float"; }

      if (ty == "bool") { return "bool"; }

      return "Any";
    } else {
      if (IsStruct(field.value.type)) {
        return "Any";
      } else {
        return "int";
      }
    }
  }